

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::setRepeated(Texture *this,bool repeated)

{
  int iVar1;
  ostream *poVar2;
  undefined4 local_70;
  undefined4 local_6c;
  bool local_31;
  TextureSaver local_18;
  TransientContextLock local_12;
  undefined1 local_11;
  TextureSaver save;
  TransientContextLock lock;
  bool repeated_local;
  Texture *this_local;
  
  if ((repeated != (bool)(this->m_isRepeated & 1U)) &&
     (this->m_isRepeated = repeated, this->m_texture != 0)) {
    local_11 = repeated;
    _save = this;
    GlResource::TransientContextLock::TransientContextLock(&local_12);
    priv::TextureSaver::TextureSaver(&local_18);
    if ((setRepeated(bool)::textureEdgeClamp == '\0') &&
       (iVar1 = __cxa_guard_acquire(&setRepeated(bool)::textureEdgeClamp), iVar1 != 0)) {
      local_31 = sfogl_ext_SGIS_texture_edge_clamp != 0 || sfogl_ext_EXT_texture_edge_clamp != 0;
      setRepeated::textureEdgeClamp = local_31;
      __cxa_guard_release(&setRepeated(bool)::textureEdgeClamp);
    }
    if ((((this->m_isRepeated & 1U) == 0) && ((setRepeated::textureEdgeClamp & 1U) == 0)) &&
       ((setRepeated::warned & 1U) == 0)) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"OpenGL extension SGIS_texture_edge_clamp unavailable");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Artifacts may occur along texture edges");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Ensure that hardware acceleration is enabled if available");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      setRepeated::warned = true;
    }
    glBindTexture(0xde1,this->m_texture);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a6,"glBindTexture(GL_TEXTURE_2D, m_texture)");
    if ((this->m_isRepeated & 1U) == 0) {
      local_6c = 0x2900;
      if ((setRepeated::textureEdgeClamp & 1U) != 0) {
        local_6c = 0x812f;
      }
    }
    else {
      local_6c = 0x2901;
    }
    glTexParameteri(0xde1,0x2802,local_6c);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a7,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                      );
    if ((this->m_isRepeated & 1U) == 0) {
      local_70 = 0x2900;
      if ((setRepeated::textureEdgeClamp & 1U) != 0) {
        local_70 = 0x812f;
      }
    }
    else {
      local_70 = 0x2901;
    }
    glTexParameteri(0xde1,0x2803,local_70);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x2a8,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP))"
                      );
    priv::TextureSaver::~TextureSaver(&local_18);
    GlResource::TransientContextLock::~TransientContextLock(&local_12);
  }
  return;
}

Assistant:

void Texture::setRepeated(bool repeated)
{
    if (repeated != m_isRepeated)
    {
        m_isRepeated = repeated;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

            if (!m_isRepeated && !textureEdgeClamp)
            {
                static bool warned = false;

                if (!warned)
                {
                    err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
                    err() << "Artifacts may occur along texture edges" << std::endl;
                    err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                    warned = true;
                }
            }

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
        }
    }
}